

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

IsNaNMatcher * Catch::Matchers::IsNaN(void)

{
  IsNaNMatcher *in_RDI;
  
  memset(in_RDI,0,0x28);
  IsNaNMatcher::IsNaNMatcher(in_RDI);
  return in_RDI;
}

Assistant:

IsNaNMatcher IsNaN() { return IsNaNMatcher(); }